

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O2

SortableOIDType * __thiscall
SNMPAgent::buildOIDWithPrefix(SNMPAgent *this,char *oid,bool overwritePrefix)

{
  SortableOIDType *this_00;
  allocator local_31;
  string temp;
  
  if (*(long *)(this + 0xb8) == 0 || overwritePrefix) {
    this_00 = (SortableOIDType *)operator_new(0x68);
    std::__cxx11::string::string((string *)&temp,oid,&local_31);
    SortableOIDType::SortableOIDType(this_00,(string *)&temp);
  }
  else {
    temp._M_dataplus._M_p = (pointer)&temp.field_2;
    temp._M_string_length = 0;
    temp.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::append((string *)&temp);
    std::__cxx11::string::append((char *)&temp);
    this_00 = (SortableOIDType *)operator_new(0x68);
    SortableOIDType::SortableOIDType(this_00,(string *)&temp);
  }
  std::__cxx11::string::~string((string *)&temp);
  if ((this_00->super_OIDType).valid == false) {
    (*(this_00->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER[1])(this_00);
    this_00 = (SortableOIDType *)0x0;
  }
  return this_00;
}

Assistant:

SortableOIDType* SNMPAgent::buildOIDWithPrefix(const char *oid, bool overwritePrefix){
    SortableOIDType* newOid;
    if(!this->oidPrefix.empty() && !overwritePrefix){
        std::string temp;
        temp.append(this->oidPrefix);
        temp.append(oid);
        newOid = new SortableOIDType(temp);
    } else {
        newOid = new SortableOIDType(oid);
    }
    if(newOid->valid){
        return newOid;
    }
    delete newOid;
    return nullptr;
}